

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

int python3Present(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (python3Present::lPython3Present < 0) {
    python3Present::lPython3Present = 0;
    builtin_strncpy(gPython3Name,"python3",8);
    iVar1 = detectPresence(gPython3Name);
    if (iVar1 == 0) {
      uVar3 = 9;
      do {
        iVar2 = (int)uVar3;
        sprintf(gPython3Name,"python3.%d",uVar3);
        iVar1 = detectPresence(gPython3Name);
        if (iVar1 != 0) goto LAB_0011a82b;
        uVar3 = (ulong)(iVar2 - 1);
      } while (iVar2 != 0);
    }
    else {
LAB_0011a82b:
      python3Present::lPython3Present = 1;
    }
    if ((tinyfd_verbose != 0) &&
       (printf("lPython3Present %d\n",(ulong)(uint)python3Present::lPython3Present),
       tinyfd_verbose != 0)) {
      printf("gPython3Name %s\n",gPython3Name);
    }
  }
  return python3Present::lPython3Present;
}

Assistant:

static int python3Present( )
{
        static int lPython3Present = -1 ;
        int i;

        if ( lPython3Present < 0 )
        {
                lPython3Present = 0 ;
                strcpy(gPython3Name , "python3" ) ;
                if ( detectPresence(gPython3Name) ) lPython3Present = 1;
                else
                {
                        for ( i = 9 ; i >= 0 ; i -- )
                        {
                                sprintf( gPython3Name , "python3.%d" , i ) ;
                                if ( detectPresence(gPython3Name) )
                                {
                                        lPython3Present = 1;
                                        break;
                                }
                        }
                        /*if ( ! lPython3Present )
                        {
                                strcpy(gPython3Name , "python" ) ;
                                if ( detectPresence(gPython3Name) ) lPython3Present = 1;
                        }*/
                }
                if (tinyfd_verbose) printf("lPython3Present %d\n", lPython3Present) ;
                if (tinyfd_verbose) printf("gPython3Name %s\n", gPython3Name) ;
        }
        return lPython3Present ;
}